

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O1

int f(sunrealtype t,N_Vector u,N_Vector udot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  lVar4 = N_VGetArrayPointer();
  lVar5 = N_VGetArrayPointer(udot);
  dVar2 = *(double *)((long)user_data + 0x10);
  dVar3 = *(double *)((long)user_data + 0x18);
  dVar1 = *(double *)((long)user_data + 0x20);
  lVar6 = 1;
  do {
    lVar7 = 0;
    do {
      dVar9 = 0.0;
      dVar8 = 0.0;
      if (lVar6 != 1) {
        dVar8 = *(double *)(lVar4 + -8 + lVar7);
      }
      if (lVar6 != 5) {
        dVar9 = *(double *)(lVar4 + 8 + lVar7);
      }
      dVar10 = 0.0;
      dVar11 = 0.0;
      if (lVar7 != 0) {
        dVar11 = *(double *)(lVar4 + -0x28 + lVar7);
      }
      if (lVar7 != 0x168) {
        dVar10 = *(double *)(lVar4 + 0x28 + lVar7);
      }
      dVar12 = *(double *)(lVar4 + lVar7) * -2.0;
      *(double *)(lVar5 + lVar7) =
           (dVar10 - dVar11) * dVar3 + (dVar12 + dVar11 + dVar10) * dVar2 +
           (dVar8 + dVar12 + dVar9) * dVar1;
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 400);
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 8;
    lVar5 = lVar5 + 8;
  } while (lVar6 != 6);
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector u, N_Vector udot, void* user_data)
{
  sunrealtype uij, udn, uup, ult, urt, hordc, horac, verdc, hdiff, hadv, vdiff;
  sunrealtype *udata, *dudata;
  int i, j;
  UserData data;

  udata  = N_VGetArrayPointer(u);
  dudata = N_VGetArrayPointer(udot);

  /* Extract needed constants from data */

  data  = (UserData)user_data;
  hordc = data->hdcoef;
  horac = data->hacoef;
  verdc = data->vdcoef;

  SUNDIALS_MARK_BEGIN(data->profobj, "RHS");

  /* Loop over all grid points. */

  for (j = 1; j <= MY; j++)
  {
    for (i = 1; i <= MX; i++)
    {
      /* Extract u at x_i, y_j and four neighboring points */

      uij = IJth(udata, i, j);
      udn = (j == 1) ? ZERO : IJth(udata, i, j - 1);
      uup = (j == MY) ? ZERO : IJth(udata, i, j + 1);
      ult = (i == 1) ? ZERO : IJth(udata, i - 1, j);
      urt = (i == MX) ? ZERO : IJth(udata, i + 1, j);

      /* Set diffusion and advection terms and load into udot */

      hdiff              = hordc * (ult - TWO * uij + urt);
      hadv               = horac * (urt - ult);
      vdiff              = verdc * (uup - TWO * uij + udn);
      IJth(dudata, i, j) = hdiff + hadv + vdiff;
    }
  }

  SUNDIALS_MARK_END(data->profobj, "RHS");

  return (0);
}